

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * tinyusdz::print_typed_attr<tinyusdz::Extent>
                   (string *__return_storage_ptr__,
                   TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *attr,string *name,
                   uint32_t indent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Path *v;
  undefined8 uVar2;
  undefined8 uVar3;
  Extent v_00;
  byte bVar4;
  string *psVar5;
  bool bVar6;
  bool bVar7;
  ostream *poVar8;
  uint32_t indent_00;
  undefined4 in_register_0000000c;
  pprint *ppVar9;
  pointer pPVar10;
  uint32_t n;
  uint32_t n_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t n_01;
  long lVar11;
  byte bVar12;
  char *pcVar13;
  byte bVar14;
  stringstream ss;
  string local_290;
  pprint *local_270;
  uint32_t local_264;
  byte local_260;
  string *local_258;
  undefined2 uStack_250;
  undefined6 uStack_24e;
  undefined2 local_248;
  undefined6 uStack_246;
  byte local_240;
  char local_23f;
  TypedTimeSamples<tinyusdz::Extent> local_238;
  string *local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  string *local_200;
  string *local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  ppVar9 = (pprint *)CONCAT44(in_register_0000000c,indent);
  local_270 = ppVar9;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  bVar7 = (attr->_attrib).has_value_;
  local_200 = __return_storage_ptr__;
  if (bVar7 == false) {
    pPVar10 = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (pPVar10 ==
        (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_start) {
      if ((attr->_value_empty == false) && ((attr->_blocked & 1U) == 0)) goto LAB_002e3ef8;
      bVar12 = (attr->_blocked ^ 1U) & attr->_value_empty;
      bVar4 = 0;
      local_260 = bVar7;
    }
    else {
      bVar4 = 1;
      bVar12 = 0;
      local_260 = bVar7;
    }
  }
  else {
    local_258 = *(string **)&(attr->_attrib).contained;
    uVar2 = *(undefined8 *)((long)&(attr->_attrib).contained + 10);
    uVar3 = *(undefined8 *)((long)&(attr->_attrib).contained + 0x12);
    uStack_250 = (undefined2)*(undefined8 *)((long)&(attr->_attrib).contained + 8);
    uStack_24e = (undefined6)uVar2;
    local_248 = (undefined2)((ulong)uVar2 >> 0x30);
    uStack_246 = (undefined6)uVar3;
    local_240 = (byte)((ulong)uVar3 >> 0x30);
    local_23f = (char)((ulong)uVar3 >> 0x38);
    local_260 = bVar7;
    ::std::
    vector<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
    ::vector(&local_238._samples,
             (vector<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
              *)((long)&(attr->_attrib).contained + 0x20));
    local_238._dirty = *(bool *)((long)&(attr->_attrib).contained + 0x38);
    pPVar10 = (pointer)CONCAT71((int7)((ulong)ppVar9 >> 8),local_238._dirty);
    bVar4 = 0;
    bVar12 = 0;
  }
  bVar14 = local_240;
  indent_00 = (uint32_t)pPVar10;
  if ((local_260 & 1) == 0) {
    bVar14 = 0;
    local_264 = 0;
  }
  else {
    if (((ulong)pPVar10 & 1) != 0) {
      TypedTimeSamples<tinyusdz::Extent>::update(&local_238);
    }
    indent_00 = (uint32_t)
                CONCAT71((int7)((ulong)local_238._samples.
                                       super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
                                       ._M_impl.super__Vector_impl_data._M_finish >> 8),
                         local_238._samples.
                         super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
                         ._M_impl.super__Vector_impl_data._M_finish !=
                         local_238._samples.
                         super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
                         ._M_impl.super__Vector_impl_data._M_start);
    local_264 = indent_00;
  }
  if ((((local_260 & 1) == 0) || (local_23f != '\0')) || (local_240 != 0)) {
    bVar7 = false;
  }
  else {
    bVar7 = local_238._samples.
            super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_238._samples.
            super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  }
  bVar6 = AttrMetas::authored(&attr->_metas);
  if (((bVar6) || (!(bool)(bVar4 | bVar7))) ||
     (n_01 = n, ((bVar12 | attr->_blocked | bVar14) & 1) != 0)) {
    pprint::Indent_abi_cxx11_(&local_290,local_270,n);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_290._M_dataplus._M_p,local_290._M_string_length);
    paVar1 = &local_290.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != paVar1) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    local_290.field_2._M_allocated_capacity = 0x5d5b3374616f6c66;
    local_290._M_string_length = 8;
    local_290.field_2._M_local_buf[8] = '\0';
    local_290._M_dataplus._M_p = (pointer)paVar1;
    poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,8);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,(name->_M_dataplus)._M_p,name->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != paVar1) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    if (attr->_blocked == true) {
      pcVar13 = " = None";
      lVar11 = 7;
LAB_002e3b6b:
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar13,lVar11);
    }
    else if (bVar14 != 0) {
      if (local_260 == 0) goto LAB_002e3f51;
      if ((local_23f != '\0') || (local_240 != 1)) {
        pcVar13 = " = [InternalError]";
        lVar11 = 0x12;
        goto LAB_002e3b6b;
      }
      uStack_210 = CONCAT62(uStack_24e,uStack_250);
      local_218 = local_258;
      local_208 = CONCAT62(uStack_246,local_248);
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = ",3);
      local_1f8 = local_218;
      uStack_1f0 = uStack_210;
      local_1e8 = local_208;
      v_00.lower._M_elems[2] = (float)(undefined4)uStack_210;
      v_00.upper._M_elems[0] = (float)uStack_210._4_4_;
      v_00.lower._M_elems._0_8_ = local_218;
      v_00.upper._M_elems[1] = (float)(undefined4)local_208;
      v_00.upper._M_elems[2] = (float)local_208._4_4_;
      ::std::operator<<(local_1a8,v_00);
    }
    bVar7 = AttrMetas::authored(&attr->_metas);
    if (bVar7) {
      local_218 = name;
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"(\n",2);
      ppVar9 = local_270;
      print_attr_metas_abi_cxx11_
                (&local_290,(tinyusdz *)attr,(AttrMeta *)(ulong)((int)local_270 + 1),indent_00);
      poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_290._M_dataplus._M_p,local_290._M_string_length);
      pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)((ulong)ppVar9 & 0xffffffff),n_00);
      poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      name = local_218;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != paVar1) {
        operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
        name = local_218;
      }
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    n_01 = extraout_EDX;
  }
  if ((char)local_264 != '\0') {
    pprint::Indent_abi_cxx11_(&local_290,local_270,n_01);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_290._M_dataplus._M_p,local_290._M_string_length);
    paVar1 = &local_290.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != paVar1) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    local_290.field_2._M_allocated_capacity = 0x5d5b3374616f6c66;
    local_290._M_string_length = 8;
    local_290.field_2._M_local_buf[8] = '\0';
    local_290._M_dataplus._M_p = (pointer)paVar1;
    poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,8);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,(name->_M_dataplus)._M_p,name->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != paVar1) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".timeSamples = ",0xf);
    if (local_260 == 0) {
LAB_002e3f51:
      __assert_fail("has_value()",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                    ,0x584,
                    "const value_type &nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::Extent>>::value() const [T = tinyusdz::Animatable<tinyusdz::Extent>]"
                   );
    }
    print_typed_timesamples<tinyusdz::Extent>(&local_290,&local_238,(uint32_t)local_270);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_290._M_dataplus._M_p,local_290._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != paVar1) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    n_01 = extraout_EDX_00;
  }
  if ((attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pprint::Indent_abi_cxx11_(&local_290,local_270,n_01);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_290._M_dataplus._M_p,local_290._M_string_length);
    paVar1 = &local_290.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != paVar1) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    local_290.field_2._M_allocated_capacity = 0x5d5b3374616f6c66;
    local_290._M_string_length = 8;
    local_290.field_2._M_local_buf[8] = '\0';
    local_290._M_dataplus._M_p = (pointer)paVar1;
    poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,8);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,(name->_M_dataplus)._M_p,name->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != paVar1) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".connect = ",0xb);
    v = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_start;
    lVar11 = ((long)(attr->_paths).
                    super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)v >> 4) * 0x4ec4ec4ec4ec4ec5;
    if (lVar11 == 0) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[InternalError]",0xf);
    }
    else if (lVar11 == 1) {
      ::std::operator<<(local_1a8,v);
    }
    else {
      ::std::operator<<(local_1a8,&attr->_paths);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
  }
  if ((local_260 == 1) &&
     (local_238._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_238._samples.
                    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_238._samples.
                          super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_238._samples.
                          super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_002e3ef8:
  psVar5 = local_200;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return psVar5;
}

Assistant:

std::string print_typed_attr(const TypedAttribute<Animatable<T>> &attr,
                             const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    bool is_value_empty = attr.is_value_empty();
    bool is_connection = attr.is_connection();
    bool has_default{false};
    bool has_timesamples{false};
    bool is_timesamples{false};
    const auto &pv = attr.get_value();

    has_default = (pv && pv.value().has_default());
    has_timesamples = (pv && pv.value().has_timesamples());
    is_timesamples = (pv && pv.value().is_timesamples());

    DCOUT("name " << name);
    DCOUT("is_value_empty " << is_value_empty);
    DCOUT("is_connection " << is_connection);
    DCOUT("is_timesamples " << is_timesamples);
    DCOUT("has_timesamples " << has_timesamples);
    DCOUT("has_default " << has_default);

    //
    // Emit default value(includes ValueBlock and empty definition) and metada
    //
    // float a METADATA
    // float a = None METADATA
    // float a = 1.5 METADATA
    // 
    // Also emit this line if the attribute contains metadata
    // Do not emit when Attribute is connection only or timesamples only.
    if (attr.metas().authored() || attr.is_blocked() || has_default || is_value_empty || ((!is_connection) && (!is_timesamples))) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      if (attr.is_blocked()) {
        ss << " = None";
      } else if (has_default) {
        T a;
        if (pv.value().get_scalar(&a)) {
          ss << " = " << a;
        } else {
          ss << " = [InternalError]";
        }
      } else { // is_value_empty
      }

      if (attr.metas().authored()) {
        ss << "(\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    // timesamples
    if (has_timesamples) {
      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".timeSamples = "
         << print_typed_timesamples(pv.value().get_timesamples(), indent);
      ss << "\n";
    }

    // connection
    if (attr.has_connections()) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      ss << ".connect = ";
      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }
      ss << "\n";
    }

  }

  return ss.str();
}